

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O1

Statement *
slang::ast::BlockStatement::fromSyntax
          (Compilation *comp,BlockStatementSyntax *syntax,ASTContext *sourceCtx,
          StatementContext *stmtCtx,bool addInitializers)

{
  uint uVar1;
  size_t sVar2;
  pointer ppSVar3;
  SyntaxKind *pSVar4;
  bool bVar5;
  bool bVar6;
  StatementBlockKind blocKind;
  int iVar7;
  ProceduralBlockSymbol *pPVar8;
  Diagnostic *this;
  InvalidStatement *pIVar9;
  undefined4 extraout_var;
  BlockStatement *pBVar10;
  long lVar11;
  SourceRange SVar12;
  string_view arg;
  ASTContext context;
  SmallVector<const_slang::ast::Statement_*,_5UL> buffer;
  BlockStatement *local_c8;
  ulong local_c0;
  Compilation *local_b8;
  BlockStatementSyntax *local_b0;
  ASTContext local_a8;
  undefined1 local_70 [64];
  
  local_a8.assertionInstance = sourceCtx->assertionInstance;
  local_a8.scope.ptr = (sourceCtx->scope).ptr;
  local_a8.lookupIndex = sourceCtx->lookupIndex;
  local_a8._12_4_ = *(undefined4 *)&sourceCtx->field_0xc;
  local_a8.flags.m_bits = (sourceCtx->flags).m_bits;
  local_a8.instanceOrProc = sourceCtx->instanceOrProc;
  local_a8.firstTempVar = sourceCtx->firstTempVar;
  local_a8.randomizeDetails = sourceCtx->randomizeDetails;
  blocKind = SemanticFacts::getStatementBlockKind(syntax);
  if ((local_a8.flags.m_bits & 0x1800) == 0) {
    if ((blocKind != Sequential) && (bVar5 = ASTContext::inAlwaysCombLatch(&local_a8), bVar5)) {
      pPVar8 = ASTContext::getProceduralBlock(&local_a8);
      SVar12 = parsing::Token::range(&syntax->begin);
      this = ASTContext::addDiag(&local_a8,(DiagCode)0x1c0008,SVar12);
      arg = SemanticFacts::getProcedureKindStr(pPVar8->procedureKind);
      Diagnostic::operator<<(this,arg);
      goto LAB_003d0177;
    }
  }
  else {
    if (blocKind - JoinAll < 2) {
      SVar12 = parsing::Token::range(&syntax->end);
      ASTContext::addDiag(&local_a8,(DiagCode)0x4d0008,SVar12);
LAB_003d0177:
      local_70._0_8_ = (Statement *)0x0;
      pIVar9 = BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                         (&comp->super_BumpAllocator,(Statement **)local_70);
      return &pIVar9->super_Statement;
    }
    if (blocKind == JoinNone) {
      local_a8.flags.m_bits = local_a8.flags.m_bits & 0x1fffffffe7ff;
    }
  }
  uVar1 = (stmtCtx->flags).m_bits;
  if (blocKind != Sequential) {
    (stmtCtx->flags).m_bits = uVar1 & 0x14 | 2;
  }
  local_70._0_8_ = local_70 + 0x18;
  local_70._8_8_ = 0;
  local_70._16_8_ = 5;
  if (addInitializers) {
    Statement::bindScopeInitializers
              (&local_a8,(SmallVectorBase<const_slang::ast::Statement_*> *)local_70);
  }
  if ((blocKind & ~JoinAll) == JoinAny) {
    local_a8.flags.m_bits = local_a8.flags.m_bits | 0x40000000000;
  }
  sVar2 = (syntax->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  local_b0 = syntax;
  if (sVar2 == 0) {
    bVar5 = false;
  }
  else {
    ppSVar3 = (syntax->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_ptr
    ;
    lVar11 = 0;
    bVar5 = false;
    local_c0 = (ulong)blocKind;
    local_b8 = comp;
    do {
      pSVar4 = *(SyntaxKind **)((long)ppSVar3 + lVar11);
      bVar6 = slang::syntax::StatementSyntax::isKind(*pSVar4);
      if (bVar6) {
        iVar7 = Statement::bind((int)pSVar4,(sockaddr *)&local_a8,(socklen_t)stmtCtx);
        local_c8 = (BlockStatement *)CONCAT44(extraout_var,iVar7);
        SmallVectorBase<slang::ast::Statement_const*>::emplace_back<slang::ast::Statement_const*>
                  ((SmallVectorBase<slang::ast::Statement_const*> *)local_70,(Statement **)&local_c8
                  );
        bVar5 = (bool)(bVar5 | (((BlockStatement *)CONCAT44(extraout_var,iVar7))->super_Statement).
                               kind == Invalid);
      }
      lVar11 = lVar11 + 8;
    } while (sVar2 << 3 != lVar11);
    blocKind = (StatementBlockKind)local_c0;
    comp = local_b8;
  }
  pBVar10 = createBlockStatement
                      (comp,(SmallVectorBase<const_slang::ast::Statement_*> *)local_70,
                       (SyntaxNode *)local_b0,blocKind);
  if (bVar5) {
    local_c8 = pBVar10;
    pBVar10 = (BlockStatement *)
              BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                        (&comp->super_BumpAllocator,(Statement **)&local_c8);
  }
  if ((Statement *)local_70._0_8_ != (Statement *)(local_70 + 0x18)) {
    operator_delete((void *)local_70._0_8_);
  }
  (stmtCtx->flags).m_bits = uVar1 & 0xb | (stmtCtx->flags).m_bits & 0x14;
  return &pBVar10->super_Statement;
}

Assistant:

Statement& BlockStatement::fromSyntax(Compilation& comp, const BlockStatementSyntax& syntax,
                                      const ASTContext& sourceCtx, StatementContext& stmtCtx,
                                      bool addInitializers) {
    ASTContext context = sourceCtx;
    auto blockKind = SemanticFacts::getStatementBlockKind(syntax);
    if (context.flags.has(ASTFlags::Function | ASTFlags::Final)) {
        if (blockKind == StatementBlockKind::JoinAll || blockKind == StatementBlockKind::JoinAny) {
            context.addDiag(diag::TimingInFuncNotAllowed, syntax.end.range());
            return badStmt(comp, nullptr);
        }
        else if (blockKind == StatementBlockKind::JoinNone) {
            // The "function body" flag does not propagate through fork-join_none
            // blocks, as all statements are allowed in those.
            context.flags &= ~ASTFlags::Function & ~ASTFlags::Final;
        }
    }
    else if (blockKind != StatementBlockKind::Sequential && context.inAlwaysCombLatch()) {
        auto proc = context.getProceduralBlock();
        SLANG_ASSERT(proc);
        context.addDiag(diag::ForkJoinAlwaysComb, syntax.begin.range())
            << SemanticFacts::getProcedureKindStr(proc->procedureKind);
        return badStmt(comp, nullptr);
    }

    // When entering a fork-join we clear any active loop flags, since the new
    // forked processes are effectively not in that loop (and statements like
    // continue and break do not apply to the outer loop).
    auto guard = ScopeGuard([&stmtCtx, savedFlags = stmtCtx.flags] {
        const auto savableFlags = StatementFlags::InLoop | StatementFlags::InForLoop |
                                  StatementFlags::InForkJoin;
        stmtCtx.flags &= ~savableFlags;
        stmtCtx.flags |= savedFlags & savableFlags;
    });

    if (blockKind != StatementBlockKind::Sequential) {
        stmtCtx.flags |= StatementFlags::InForkJoin;
        stmtCtx.flags &= ~(StatementFlags::InLoop | StatementFlags::InForLoop);
    }

    bool anyBad = false;
    SmallVector<const Statement*> buffer;

    if (addInitializers)
        bindScopeInitializers(context, buffer);

    if (blockKind == StatementBlockKind::JoinAny || blockKind == StatementBlockKind::JoinNone)
        context.flags |= ASTFlags::ForkJoinAnyNone;

    for (auto item : syntax.items) {
        if (StatementSyntax::isKind(item->kind)) {
            auto& stmt = Statement::bind(item->as<StatementSyntax>(), context, stmtCtx,
                                         /* inList */ true);
            buffer.push_back(&stmt);
            anyBad |= stmt.bad();
        }
    }

    auto result = createBlockStatement(comp, buffer, syntax, blockKind);
    if (anyBad)
        return badStmt(comp, result);

    return *result;
}